

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

bool __thiscall TTD::MarkTable::MarkAndTestAddr<(TTD::MarkTableTag)5>(MarkTable *this,void *vaddr)

{
  int32 iVar1;
  bool bVar2;
  bool notMarked;
  int32 idx;
  void *vaddr_local;
  MarkTable *this_local;
  
  iVar1 = FindIndexForKeyWGrow(this,vaddr);
  bVar2 = this->m_addrArray[iVar1] == 0;
  if (bVar2) {
    this->m_addrArray[iVar1] = (uint64)vaddr;
    this->m_markArray[iVar1] = FunctionBodyTag;
    this->m_count = this->m_count + 1;
    this->m_handlerCounts[5] = this->m_handlerCounts[5] + 1;
  }
  if (this->m_markArray[iVar1] != FunctionBodyTag) {
    TTDAbort_unrecoverable_error("We had some sort of collision.");
  }
  return bVar2;
}

Assistant:

bool MarkAndTestAddr(const void* vaddr)
        {
            int32 idx = this->FindIndexForKeyWGrow(vaddr);

            //we really want to do the check on m_markArray but since we know nothing has been cleared we can check the addrArray for better cache behavior
            bool notMarked = this->m_addrArray[idx] == 0;

            if (notMarked)
            {
                this->m_addrArray[idx] = reinterpret_cast<uint64>(vaddr);
                this->m_markArray[idx] = kindtag;

                this->m_count++;
                (this->m_handlerCounts[(uint32)kindtag])++;
            }
            TTDAssert(this->m_markArray[idx] == kindtag, "We had some sort of collision.");

            return notMarked;
        }